

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O0

int CVmObjFile::s_getp_getRootName(vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_obj_id_t obj;
  undefined4 extraout_var;
  vm_val_t *in_RDI;
  char *sl;
  CVmNetFile *nf;
  char *ret;
  char buf [8192];
  CVmNativeCodeDesc *in_stack_ffffffffffffdfa8;
  CVmNetFile *in_stack_ffffffffffffdfb0;
  vm_val_t *in_stack_ffffffffffffdfb8;
  char *in_stack_ffffffffffffdfc0;
  vm_val_t *local_2030;
  vm_val_t local_2028 [513];
  vm_val_t *local_10;
  
  local_10 = in_RDI;
  if ((s_getp_getRootName(vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&s_getp_getRootName(vm_val_t*,unsigned_int*)::desc), iVar1 != 0))
  {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&s_getp_getRootName::desc,1);
    __cxa_guard_release(&s_getp_getRootName(vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffdfb8,(uint *)in_stack_ffffffffffffdfb0,
                     in_stack_ffffffffffffdfa8);
  if (iVar1 == 0) {
    CVmBif::pop_fname_val(in_stack_ffffffffffffdfc0,(size_t)in_stack_ffffffffffffdfb8);
    iVar1 = CVmNetFile::open((char *)local_2028,0,0,0xb,0);
    iVar1 = CVmNetFile::is_net_file((CVmNetFile *)CONCAT44(extraout_var,iVar1));
    if (iVar1 == 0) {
      local_2030 = (vm_val_t *)os_get_root_name((char *)in_stack_ffffffffffffdfb0);
    }
    else {
      in_stack_ffffffffffffdfc0 = strrchr((char *)local_2028,0x2f);
      if (in_stack_ffffffffffffdfc0 == (char *)0x0) {
        in_stack_ffffffffffffdfb8 = local_2028;
        local_2030 = in_stack_ffffffffffffdfb8;
      }
      else {
        in_stack_ffffffffffffdfb8 = (vm_val_t *)(in_stack_ffffffffffffdfc0 + 1);
        local_2030 = in_stack_ffffffffffffdfb8;
      }
    }
    iVar1 = (int)((ulong)in_stack_ffffffffffffdfc0 >> 0x20);
    CVmNetFile::abandon(in_stack_ffffffffffffdfb0);
    strlen((char *)local_2030);
    obj = CVmObjString::create(iVar1,(char *)in_stack_ffffffffffffdfb8,(size_t)local_10);
    vm_val_t::set_obj(local_10,obj);
  }
  return 1;
}

Assistant:

int CVmObjFile::s_getp_getRootName(VMG_ vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(1);
    char buf[OSFNMAX*2];
    const char *ret;

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the string argument into our buffer */
    CVmBif::pop_fname_val(vmg_ buf, sizeof(buf));

    /* set up a no-access file descriptor to determine where the file is */
    CVmNetFile *nf = CVmNetFile::open(vmg_ buf, 0, 0, OSFTUNK, 0);

    /*
     *   If the file is on the network storage server, we always use the Unix
     *   convention, regardless of the local naming rules.  Otherwise, use
     *   the local OS API to get the root name.  
     */
    if (nf->is_net_file())
    {
        /* 
         *   We're in network mode, so use the Unix path conventions.  Simply
         *   scan for the last '/' character; if we find it, the root name is
         *   the part after the '/', otherwise it's the whole string.  
         */
        const char *sl = strrchr(buf, '/');
        ret = (sl != 0 ? sl + 1 : buf);
    }
    else
    {
        /* it's not a network file - use the local filename rules */
        ret = os_get_root_name(buf);
    }

    /* done with the net file desriptor */
    nf->abandon(vmg0_);

    /* return the string */
    retval->set_obj(CVmObjString::create(vmg_ FALSE, ret, strlen(ret)));

    /* handled */
    return TRUE;
}